

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * find_global_D_Sym(D_Scope *st,char *name,char *end)

{
  uint h_00;
  size_t sVar1;
  D_Sym *sym;
  int local_48;
  D_Scope *local_40;
  D_Scope *cur;
  uint h;
  uint len;
  D_Sym *s;
  char *end_local;
  char *name_local;
  D_Scope *st_local;
  
  if (end == (char *)0x0) {
    sVar1 = strlen(name);
    local_48 = (int)sVar1;
  }
  else {
    local_48 = (int)end - (int)name;
  }
  h_00 = strhashl(name,local_48);
  for (local_40 = st; local_40->up != (D_Scope *)0x0; local_40 = local_40->search) {
  }
  sym = find_D_Sym_internal(local_40,name,local_48,h_00);
  if (sym == (D_Sym *)0x0) {
    st_local = (D_Scope *)0x0;
  }
  else {
    st_local = (D_Scope *)current_D_Sym(st,sym);
  }
  return (D_Sym *)st_local;
}

Assistant:

D_Sym *find_global_D_Sym(D_Scope *st, char *name, char *end) {
  D_Sym *s;
  uint len = end ? end - name : strlen(name);
  uint h = strhashl(name, len);
  D_Scope *cur = st;
  while (cur->up) cur = cur->search;
  s = find_D_Sym_internal(cur, name, len, h);
  if (s) return current_D_Sym(st, s);
  return NULL;
}